

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

UVec2 __thiscall
vkt::texture::util::calcLevelBounds
          (util *this,Vec2 *lodBounds,int levelCount,VkSamplerMipmapMode mipmapFilter)

{
  int iVar1;
  int iVar2;
  int ndx;
  uint uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar3 = levelCount - 1;
  fVar7 = (float)(int)uVar3;
  *(undefined8 *)this = 0;
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
    fVar6 = lodBounds->m_data[0];
    iVar2 = 0;
    iVar1 = 0;
    if (0.5 < fVar6) {
      if (fVar7 + 0.5 <= fVar6) {
        iVar1 = (int)(*(float *)(&DAT_00b56228 + (ulong)(uVar3 >> 0x1f) * 4) + fVar7);
      }
      else {
        fVar6 = ceilf(fVar6 + 0.5);
        iVar1 = (int)fVar6 + -1;
      }
    }
    *(int *)this = iVar1;
    fVar6 = lodBounds->m_data[1];
    if (0.5 <= fVar6) {
      if (fVar7 + 0.5 <= fVar6) {
        iVar2 = (int)(fVar7 + *(float *)(&DAT_00b56228 + (ulong)(uVar3 >> 0x1f) * 4));
      }
      else {
        fVar7 = floorf(fVar6 + 0.5);
        iVar2 = (int)fVar7;
      }
    }
    *(int *)(this + 4) = iVar2;
  }
  else {
    fVar6 = *(float *)(&DAT_00b56228 + (ulong)(uVar3 >> 0x1f) * 4);
    lVar4 = 0;
    do {
      fVar5 = lodBounds->m_data[lVar4];
      iVar1 = (int)(fVar6 + fVar7);
      if ((fVar5 < fVar7) && (iVar1 = 0, 0.0 <= fVar5)) {
        fVar5 = floorf(fVar5);
        iVar1 = (int)fVar5;
      }
      *(int *)(this + lVar4 * 4) = iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
  }
  return (UVec2)(uint  [2])this;
}

Assistant:

UVec2 calcLevelBounds (const Vec2&			lodBounds,
					   const int			levelCount,
					   VkSamplerMipmapMode	mipmapFilter)
{
	DE_ASSERT(lodBounds[0] <= lodBounds[1]);
	DE_ASSERT(levelCount > 0);

	const float q = (float) (levelCount - 1);

	UVec2 levelBounds;

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST)
	{
		if (lodBounds[0] <= 0.5f)
		{
			levelBounds[0] = 0;
		}
		else if (lodBounds[0] < q + 0.5f)
		{
			levelBounds[0] = deCeilFloatToInt32(lodBounds[0] + 0.5f) - 1;
		}
		else
		{
			levelBounds[0] = deRoundFloatToInt32(q);
		}

		if (lodBounds[1] < 0.5f)
		{
			levelBounds[1] = 0;
		}
		else if (lodBounds[1] < q + 0.5f)
		{
			levelBounds[1] = deFloorFloatToInt32(lodBounds[1] + 0.5f);
		}
		else
		{
			levelBounds[1] = deRoundFloatToInt32(q);
		}
	}
	else
	{
		for (int ndx = 0; ndx < 2; ++ndx)
		{
			if (lodBounds[ndx] >= q)
			{
				levelBounds[ndx] = deRoundFloatToInt32(q);
			}
			else
			{
				levelBounds[ndx] = lodBounds[ndx] < 0.0f ? 0 : deFloorFloatToInt32(lodBounds[ndx]);
			}
		}
	}

	return levelBounds;
}